

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O1

int Internal_Convertfwrite
              (CPalThread *pthrCurrent,void *buffer,size_t size,size_t count,FILE *stream,
              BOOL convert)

{
  FILE *pFVar1;
  int iVar2;
  DWORD DVar3;
  LPSTR lpMultiByteStr;
  size_t sVar4;
  int *piVar5;
  INT local_34 [2];
  int iError;
  
  local_34[0] = 0;
  iVar2 = WideCharToMultiByte(0,0,(LPCWSTR)pthrCurrent,(int)buffer,(LPSTR)0x0,0,(LPCSTR)0x0,
                              (LPBOOL)0x0);
  if (iVar2 == 0) {
    fprintf(_stderr,"] %s %s:%d","Internal_Convertfwrite",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
            ,0x46);
    pFVar1 = _stderr;
    DVar3 = GetLastError();
    fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar3);
  }
  else {
    lpMultiByteStr = (LPSTR)CorUnix::InternalMalloc((long)iVar2);
    if (lpMultiByteStr == (LPSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_0031aecb:
        abort();
      }
      piVar5 = __errno_location();
      *piVar5 = 8;
    }
    else {
      iVar2 = WideCharToMultiByte(0,0,(LPCWSTR)pthrCurrent,(int)buffer,lpMultiByteStr,iVar2,
                                  (LPCSTR)0x0,(LPBOOL)0x0);
      if (iVar2 == 0) {
        fprintf(_stderr,"] %s %s:%d","Internal_Convertfwrite",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                ,0x53);
        pFVar1 = _stderr;
        DVar3 = GetLastError();
        fprintf(pFVar1,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar3);
      }
      else {
        sVar4 = CorUnix::InternalFwrite(lpMultiByteStr,1,(long)iVar2,(FILE *)size,local_34);
        if (local_34[0] == 0) {
          CorUnix::InternalFree(lpMultiByteStr);
          return (int)sVar4;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031aecb;
      }
      CorUnix::InternalFree(lpMultiByteStr);
    }
  }
  return -1;
}

Assistant:

static int Internal_Convertfwrite(CPalThread *pthrCurrent, const void *buffer, size_t size, size_t count, FILE *stream, BOOL convert)
{
    int ret;
    int iError = 0;

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
    clearerr (stream);
#endif

    if(convert)
    {
        int nsize;
        LPSTR newBuff = 0;
        nsize = WideCharToMultiByte(CP_ACP, 0,(LPCWSTR)buffer, count, 0, 0, 0, 0);
        if (!nsize)
        {
            ASSERT("WideCharToMultiByte failed.  Error is %d\n", GetLastError());
            return -1;
        }
        newBuff = (LPSTR) InternalMalloc(nsize);
        if (!newBuff)
        {
            ERROR("InternalMalloc failed\n");
            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            return -1;
        }
        nsize = WideCharToMultiByte(CP_ACP, 0, (LPCWSTR)buffer, count, newBuff, nsize, 0, 0);
        if (!nsize)
        {
            ASSERT("WideCharToMultiByte failed.  Error is %d\n", GetLastError());
            InternalFree(newBuff);
            return -1;
        }
        ret = InternalFwrite(newBuff, 1, nsize, stream, &iError);
        if (iError != 0)
        {
            ERROR("InternalFwrite did not write the whole buffer. Error is %d\n", iError);
            InternalFree(newBuff);
            return -1;
        }
        InternalFree(newBuff);
   }
   else
   {
        ret = InternalFwrite(buffer, size, count, stream, &iError);
        if (iError != 0)
        {
            ERROR("InternalFwrite did not write the whole buffer. Error is %d\n", iError);
            return -1;
        }
   }
   return ret;

}